

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O0

Circle * EDCircles::addCircle
                   (Circle *circles,int *noCircles,double xc,double yc,double r,
                   double circleFitError,double *x,double *y,int noPixels)

{
  int noPixels_local;
  double *y_local;
  double *x_local;
  double circleFitError_local;
  double r_local;
  double yc_local;
  double xc_local;
  int *noCircles_local;
  Circle *circles_local;
  
  circles[*noCircles].xc = xc;
  circles[*noCircles].yc = yc;
  circles[*noCircles].r = r;
  circles[*noCircles].circleFitError = circleFitError;
  circles[*noCircles].coverRatio = (double)noPixels / (r * 6.283185307179586);
  circles[*noCircles].x = x;
  circles[*noCircles].y = y;
  circles[*noCircles].noPixels = noPixels;
  circles[*noCircles].isEllipse = false;
  *noCircles = *noCircles + 1;
  return circles + (*noCircles + -1);
}

Assistant:

Circle * EDCircles::addCircle(Circle *circles, int &noCircles,double xc, double yc, double r, double circleFitError, double * x, double * y, int noPixels)
{
	circles[noCircles].xc = xc;
	circles[noCircles].yc = yc;
	circles[noCircles].r = r;
	circles[noCircles].circleFitError = circleFitError;
	circles[noCircles].coverRatio = noPixels / (TWOPI*r);

	circles[noCircles].x = x;
	circles[noCircles].y = y;
	circles[noCircles].noPixels = noPixels;

	circles[noCircles].isEllipse = false;

	noCircles++;

	return &circles[noCircles - 1];
}